

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnDataSegmentData
          (BinaryReaderObjdump *this,Index index,void *src_data,Address size)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  const_pointer pvVar4;
  pointer this_00;
  Offset OVar5;
  long lVar6;
  reference reloc_00;
  Offset abs_offset;
  Reloc *reloc;
  Offset segment_offset;
  Offset segment_start;
  Offset data_start;
  string_view name;
  Address size_local;
  void *src_data_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  name._M_str = (char *)size;
  bVar2 = ShouldPrintDetails(this);
  if (bVar2) {
    PrintDetails(this," - segment[%u]",(ulong)index);
    _data_start = BinaryReaderObjdumpBase::GetSegmentName
                            (&this->super_BinaryReaderObjdumpBase,index);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&data_start);
    if (!bVar2) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&data_start);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&data_start);
      PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pvVar4);
    }
    if ((this->data_flags_ & 1) == 0) {
      PrintDetails(this," memory=%u",(ulong)this->data_mem_index_);
    }
    else {
      PrintDetails(this," passive");
    }
    PrintDetails(this," size=%lu",name._M_str);
    if ((this->data_flags_ & 1) == 0) {
      PrintInitExpr(this,&this->current_init_expr_,true,true);
    }
    else {
      PrintDetails(this,"\n");
    }
    this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator->
                        (&this->out_stream_);
    Stream::WriteMemoryDump
              (&this_00->super_Stream,src_data,(size_t)name._M_str,this->data_offset_,Yes,"  - ",
               (char *)0x0);
    if ((((this->super_BinaryReaderObjdumpBase).options_)->relocs & 1U) == 0) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      OVar5 = BinaryReaderObjdumpBase::GetSectionStart(&this->super_BinaryReaderObjdumpBase,Data);
      lVar6 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset - (long)name._M_str;
      while ((uVar1 = this->next_data_reloc_,
             sVar3 = std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::size
                               (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                 data_relocations), uVar1 < sVar3 &&
             (reloc_00 = std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::operator[]
                                   (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                     data_relocations,(ulong)this->next_data_reloc_),
             OVar5 + reloc_00->offset <=
             ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate
             .state)->offset))) {
        BinaryReaderObjdumpBase::PrintRelocation
                  (&this->super_BinaryReaderObjdumpBase,reloc_00,
                   (reloc_00->offset - (lVar6 - OVar5)) + this->data_offset_);
        this->next_data_reloc_ = this->next_data_reloc_ + 1;
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnDataSegmentData(Index index,
                                              const void* src_data,
                                              Address size) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }

  PrintDetails(" - segment[%" PRIindex "]", index);
  auto name = GetSegmentName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  if (data_flags_ & SegPassive) {
    PrintDetails(" passive");
  } else {
    PrintDetails(" memory=%" PRIindex, data_mem_index_);
  }
  PrintDetails(" size=%" PRIaddress, size);
  if (data_flags_ & SegPassive) {
    PrintDetails("\n");
  } else {
    PrintInitExpr(current_init_expr_, /*as_unsigned=*/true);
  }

  out_stream_->WriteMemoryDump(src_data, size, data_offset_, PrintChars::Yes,
                               "  - ");

  // Print relocations from this segment.
  if (!options_->relocs) {
    return Result::Ok;
  }

  Offset data_start = GetSectionStart(BinarySection::Data);
  Offset segment_start = state->offset - size;
  Offset segment_offset = segment_start - data_start;
  while (next_data_reloc_ < objdump_state_->data_relocations.size()) {
    const Reloc& reloc = objdump_state_->data_relocations[next_data_reloc_];
    Offset abs_offset = data_start + reloc.offset;
    if (abs_offset > state->offset) {
      break;
    }
    PrintRelocation(reloc, reloc.offset - segment_offset + data_offset_);
    next_data_reloc_++;
  }

  return Result::Ok;
}